

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_filedata(curl_mimepart *part,char *filename)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  undefined1 local_c0 [4];
  CURLcode res;
  stat sbuf;
  char *base;
  CURLcode result;
  char *filename_local;
  curl_mimepart *part_local;
  
  base._4_4_ = CURLE_OK;
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    if (filename != (char *)0x0) {
      iVar1 = stat64(filename,(stat64 *)local_c0);
      if ((iVar1 != 0) || (iVar1 = access(filename,4), iVar1 != 0)) {
        base._4_4_ = CURLE_READ_ERROR;
      }
      pcVar3 = (*Curl_cstrdup)(filename);
      part->data = pcVar3;
      if (part->data == (char *)0x0) {
        base._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      part->datasize = -1;
      if ((base._4_4_ == CURLE_OK) && (((uint)sbuf.st_nlink & 0xf000) == 0x8000)) {
        part->datasize = sbuf.st_rdev;
        part->seekfunc = mime_file_seek;
      }
      part->readfunc = mime_file_read;
      part->freefunc = mime_file_free;
      part->kind = MIMEKIND_FILE;
      sbuf.__glibc_reserved[2] = (__syscall_slong_t)strippath(filename);
      if ((char *)sbuf.__glibc_reserved[2] == (char *)0x0) {
        base._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar2 = curl_mime_filename(part,(char *)sbuf.__glibc_reserved[2]);
        if (CVar2 != CURLE_OK) {
          base._4_4_ = CVar2;
        }
        (*Curl_cfree)((void *)sbuf.__glibc_reserved[2]);
      }
    }
    part_local._4_4_ = base._4_4_;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_filedata(curl_mimepart *part, const char *filename)
{
  CURLcode result = CURLE_OK;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(filename) {
    char *base;
    struct_stat sbuf;

    if(stat(filename, &sbuf) || access(filename, R_OK))
      result = CURLE_READ_ERROR;

    part->data = strdup(filename);
    if(!part->data)
      result = CURLE_OUT_OF_MEMORY;

    part->datasize = -1;
    if(!result && S_ISREG(sbuf.st_mode)) {
      part->datasize = filesize(filename, sbuf);
      part->seekfunc = mime_file_seek;
    }

    part->readfunc = mime_file_read;
    part->freefunc = mime_file_free;
    part->kind = MIMEKIND_FILE;

    /* As a side effect, set the filename to the current file's base name.
       It is possible to withdraw this by explicitly calling
       curl_mime_filename() with a NULL filename argument after the current
       call. */
    base = strippath(filename);
    if(!base)
      result = CURLE_OUT_OF_MEMORY;
    else {
      CURLcode res = curl_mime_filename(part, base);

      if(res)
        result = res;
      free(base);
    }
  }
  return result;
}